

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O2

double TasGrid::Optimizer::getNextNode<(TasGrid::TypeOneDRule)19>
                 (vector<double,_std::allocator<double>_> *nodes)

{
  OptimizerResult OVar1;
  CurrentNodes<(TasGrid::TypeOneDRule)19> local_38;
  
  CurrentNodes<(TasGrid::TypeOneDRule)19>::CurrentNodes(&local_38,nodes);
  OVar1 = computeMaximum<(TasGrid::TypeOneDRule)19>(&local_38);
  CurrentNodes<(TasGrid::TypeOneDRule)19>::~CurrentNodes(&local_38);
  return OVar1.node;
}

Assistant:

double getNextNode(std::vector<double> const &nodes){
    return computeMaximum(CurrentNodes<rule>(nodes)).node;
}